

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

Iterator * __thiscall
TTD::TTEventList::GetIteratorAtLast_ReplayOnly(Iterator *__return_storage_ptr__,TTEventList *this)

{
  size_t sVar1;
  EventLogEntry *data;
  size_t ipos;
  size_t cpos;
  TTEventList *this_local;
  
  if (this->m_headBlock == (TTEventListLink *)0x0) {
    Iterator::Iterator(__return_storage_ptr__,(TTEventListLink *)0x0,0,this->m_vtable,
                       &this->m_previousEventMap);
  }
  else {
    sVar1 = this->m_headBlock->StartPos;
    do {
      ipos = sVar1;
      sVar1 = this->m_vtable[*(uint *)(this->m_headBlock->BlockData + ipos)].DataSize + ipos;
    } while (sVar1 != this->m_headBlock->CurrPos);
    Iterator::Iterator(__return_storage_ptr__,this->m_headBlock,ipos,this->m_vtable,
                       &this->m_previousEventMap);
  }
  return __return_storage_ptr__;
}

Assistant:

TTEventList::Iterator TTEventList::GetIteratorAtLast_ReplayOnly() const
    {
        if(this->m_headBlock == nullptr)
        {
            return Iterator(nullptr, 0, this->m_vtable, &this->m_previousEventMap);
        }
        else
        {
            size_t cpos = this->m_headBlock->StartPos;
            size_t ipos = 0;
            do
            {
                ipos = cpos;

                NSLogEvents::EventLogEntry* data = reinterpret_cast<NSLogEvents::EventLogEntry*>(this->m_headBlock->BlockData + cpos);
                cpos += this->m_vtable[(uint32)data->EventKind].DataSize;
            } while(cpos != this->m_headBlock->CurrPos);

            return Iterator(this->m_headBlock, ipos, this->m_vtable, &this->m_previousEventMap);
        }
    }